

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

var * __thiscall cs::domain_manager::get_var(domain_manager *this,string *name)

{
  stack_pointer psVar1;
  domain_type *pdVar2;
  size_t sVar3;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_unsigned_long>_>
  puVar4;
  runtime_error *this_00;
  long *plVar5;
  size_type *psVar6;
  domain_type *domain;
  domain_type *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  psVar1 = *this->fiber_stack;
  if (psVar1 == (stack_pointer)0x0) {
LAB_00212a49:
    pdVar2 = (this->m_data).m_start;
    this_01 = (this->m_data).m_current;
    do {
      if (this_01 == pdVar2) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::operator+(&local_60,"Use of undefined variable \"",name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_60);
        local_40._M_dataplus._M_p = (pointer)*plVar5;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_40._M_dataplus._M_p == psVar6) {
          local_40.field_2._M_allocated_capacity = *psVar6;
          local_40.field_2._8_8_ = plVar5[3];
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        }
        else {
          local_40.field_2._M_allocated_capacity = *psVar6;
        }
        local_40._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        runtime_error::runtime_error(this_00,&local_40);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      this_01 = this_01 + -1;
      sVar3 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::count<std::__cxx11::string>
                        ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                          *)this_01,name);
    } while (sVar3 == 0);
    puVar4 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                         *)this_01,name);
  }
  else {
    pdVar2 = psVar1->m_start;
    this_01 = psVar1->m_current;
    do {
      if (this_01 == pdVar2) goto LAB_00212a49;
      this_01 = this_01 + -1;
      sVar3 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::count<std::__cxx11::string>
                        ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                          *)this_01,name);
    } while (sVar3 == 0);
    puVar4 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::
             at<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                         *)this_01,name);
  }
  return (this_01->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
         super__Vector_impl_data._M_start + *puVar4;
}

Assistant:

inline var &get_var(const std::string &name)
		{
			if (fiber_stack != nullptr) {
				for (auto &domain: *fiber_stack)
					if (domain.exist(name))
						return domain.get_var_no_check(name);
			}
			for (auto &domain: m_data)
				if (domain.exist(name))
					return domain.get_var_no_check(name);
			throw runtime_error("Use of undefined variable \"" + name + "\".");
		}